

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O1

float * __thiscall
delay_line<float>::output(delay_line<float> *this,uint32_t frames_needed,size_t *input_frames_used)

{
  auto_array<float> *this_00;
  size_t *psVar1;
  float *__dest;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  this_00 = &this->delay_output_buffer;
  uVar3 = (ulong)frames_needed;
  uVar2 = (this->super_processor).channels * uVar3;
  if ((this->delay_output_buffer).capacity_ < uVar2) {
    auto_array<float>::reserve(this_00,uVar2);
  }
  (this->delay_output_buffer).length_ = 0;
  auto_array<float>::push
            (this_00,(this->delay_input_buffer).data_,(this->super_processor).channels * uVar3);
  uVar4 = (this->super_processor).channels * uVar3;
  uVar2 = (this->delay_input_buffer).length_;
  if ((uVar4 <= uVar2) && (__dest = (this->delay_input_buffer).data_, __dest != (float *)0x0)) {
    memmove(__dest,__dest + uVar4,(uVar2 - uVar4) * 4);
    psVar1 = &(this->delay_input_buffer).length_;
    *psVar1 = *psVar1 - uVar4;
  }
  *input_frames_used = uVar3;
  return this_00->data_;
}

Assistant:

T * output(uint32_t frames_needed, size_t * input_frames_used)
  {
    if (delay_output_buffer.capacity() < frames_to_samples(frames_needed)) {
      delay_output_buffer.reserve(frames_to_samples(frames_needed));
    }

    delay_output_buffer.clear();
    delay_output_buffer.push(delay_input_buffer.data(),
                             frames_to_samples(frames_needed));
    delay_input_buffer.pop(nullptr, frames_to_samples(frames_needed));
    *input_frames_used = frames_needed;

    return delay_output_buffer.data();
  }